

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm2d.c
# Opt level: O0

void av1_inv_txfm2d_add_64x32_c(int32_t *input,uint16_t *output,int stride,TX_TYPE tx_type,int bd)

{
  void *in_RDI;
  int txfm_buf [2176];
  int32_t mod_input [2048];
  TX_SIZE in_stack_ffffffffffffbdee;
  TX_TYPE in_stack_ffffffffffffbdef;
  int32_t *in_stack_ffffffffffffbdf0;
  int in_stack_ffffffffffffbdfc;
  uint16_t *in_stack_ffffffffffffbe00;
  int32_t *in_stack_ffffffffffffbe08;
  int in_stack_ffffffffffffbe18;
  undefined1 local_2050 [4096];
  undefined1 auStack_1050 [4168];
  
  memcpy(local_2050,in_RDI,0x1000);
  memset(auStack_1050,0,0x1000);
  inv_txfm2d_add_facade
            (in_stack_ffffffffffffbe08,in_stack_ffffffffffffbe00,in_stack_ffffffffffffbdfc,
             in_stack_ffffffffffffbdf0,in_stack_ffffffffffffbdef,in_stack_ffffffffffffbdee,
             in_stack_ffffffffffffbe18);
  return;
}

Assistant:

void av1_inv_txfm2d_add_64x32_c(const int32_t *input, uint16_t *output,
                                int stride, TX_TYPE tx_type, int bd) {
  // Remap 32x32 input into a modified 64x32 by:
  // - Copying over these values in top-left 32x32 locations.
  // - Setting the rest of the locations to 0.
  int32_t mod_input[32 * 64];
  memcpy(mod_input, input, 32 * 32 * sizeof(*mod_input));
  memset(mod_input + 32 * 32, 0, 32 * 32 * sizeof(*mod_input));
  DECLARE_ALIGNED(32, int, txfm_buf[64 * 32 + 64 + 64]);
  inv_txfm2d_add_facade(mod_input, output, stride, txfm_buf, tx_type, TX_64X32,
                        bd);
}